

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingPriorityQueue.hpp
# Opt level: O1

optional<std::pair<helics::route_id,_helics::ActionMessage>_> * __thiscall
gmlc::containers::
BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
::try_pop(optional<std::pair<helics::route_id,_helics::ActionMessage>_> *__return_storage_ptr__,
         BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
         *this)

{
  _Elt_pointer ppVar1;
  pointer ppVar2;
  int iVar3;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->m_pullLock);
  if (iVar3 == 0) {
    ppVar1 = (this->priorityQueue).c.
             super__Deque_base<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((this->priorityQueue).c.
        super__Deque_base<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar1) {
      checkPullAndSwap(this);
      ppVar2 = (this->pullElements).
               super__Vector_base<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((this->pullElements).
          super__Vector_base<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
          ._M_impl.super__Vector_impl_data._M_start == ppVar2) {
        (__return_storage_ptr__->
        super__Optional_base<std::pair<helics::route_id,_helics::ActionMessage>,_false,_false>).
        _M_payload.
        super__Optional_payload<std::pair<helics::route_id,_helics::ActionMessage>,_true,_false,_false>
        .super__Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>.
        _M_engaged = false;
      }
      else {
        (__return_storage_ptr__->
        super__Optional_base<std::pair<helics::route_id,_helics::ActionMessage>,_false,_false>).
        _M_payload.
        super__Optional_payload<std::pair<helics::route_id,_helics::ActionMessage>,_true,_false,_false>
        .super__Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>.
        _M_payload._M_value.first.rid = ppVar2[-1].first.rid;
        helics::ActionMessage::ActionMessage
                  (&(__return_storage_ptr__->
                    super__Optional_base<std::pair<helics::route_id,_helics::ActionMessage>,_false,_false>
                    )._M_payload.
                    super__Optional_payload<std::pair<helics::route_id,_helics::ActionMessage>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>
                    ._M_payload._M_value.second,&ppVar2[-1].second);
        (__return_storage_ptr__->
        super__Optional_base<std::pair<helics::route_id,_helics::ActionMessage>,_false,_false>).
        _M_payload.
        super__Optional_payload<std::pair<helics::route_id,_helics::ActionMessage>,_true,_false,_false>
        .super__Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>.
        _M_engaged = true;
        ppVar2 = (this->pullElements).
                 super__Vector_base<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        (this->pullElements).
        super__Vector_base<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppVar2 + -1;
        helics::ActionMessage::~ActionMessage(&ppVar2[-1].second);
        checkPullAndSwap(this);
      }
    }
    else {
      (__return_storage_ptr__->
      super__Optional_base<std::pair<helics::route_id,_helics::ActionMessage>,_false,_false>).
      _M_payload.
      super__Optional_payload<std::pair<helics::route_id,_helics::ActionMessage>,_true,_false,_false>
      .super__Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>._M_payload.
      _M_value.first.rid = (ppVar1->first).rid;
      helics::ActionMessage::ActionMessage
                (&(__return_storage_ptr__->
                  super__Optional_base<std::pair<helics::route_id,_helics::ActionMessage>,_false,_false>
                  )._M_payload.
                  super__Optional_payload<std::pair<helics::route_id,_helics::ActionMessage>,_true,_false,_false>
                  .super__Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>
                  ._M_payload._M_value.second,&ppVar1->second);
      (__return_storage_ptr__->
      super__Optional_base<std::pair<helics::route_id,_helics::ActionMessage>,_false,_false>).
      _M_payload.
      super__Optional_payload<std::pair<helics::route_id,_helics::ActionMessage>,_true,_false,_false>
      .super__Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>._M_engaged
           = true;
      std::
      deque<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
      ::pop_front(&(this->priorityQueue).c);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_pullLock);
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

std::optional<T> BlockingPriorityQueue<T, MUTEX, COND>::try_pop()
    {
        std::lock_guard<MUTEX> pullLock(m_pullLock);  // first pullLock
        if (!priorityQueue.empty()) {
            std::optional<T> val(std::move(priorityQueue.front()));
            priorityQueue.pop();
            return val;
        }
        checkPullAndSwap();
        if (pullElements.empty()) {
            return std::nullopt;
        }
        // do it this way to allow movable only types
        std::optional<T> val(std::move(pullElements.back()));
        pullElements.pop_back();
        checkPullAndSwap();
        return val;
    }